

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O3

void __thiscall
ConsoleTable::ConsoleTable
          (ConsoleTable *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          headers)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  iterator __position;
  long lVar3;
  allocator_type local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  TableStyle *local_50;
  Widths *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  unsigned_long local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->headers,headers,&local_69);
  local_48 = &this->widths;
  local_50 = &this->BasicStyle;
  paVar1 = &(this->BasicStyle).horizontal.field_2;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rows).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BasicStyle).horizontal._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"-","");
  psVar2 = &(this->BasicStyle).vertical;
  (this->BasicStyle).vertical._M_dataplus._M_p = (pointer)&(this->BasicStyle).vertical.field_2;
  local_58 = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"|","");
  (this->BasicStyle).top.left._M_dataplus._M_p = (pointer)&(this->BasicStyle).top.left.field_2;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).top,"+","");
  (this->BasicStyle).top.intersect._M_dataplus._M_p =
       (pointer)&(this->BasicStyle).top.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->BasicStyle).top.intersect,"+","");
  (this->BasicStyle).top.right._M_dataplus._M_p = (pointer)&(this->BasicStyle).top.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).top.right,"+","");
  (this->BasicStyle).middle.left._M_dataplus._M_p = (pointer)&(this->BasicStyle).middle.left.field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).middle,"+","");
  (this->BasicStyle).middle.intersect._M_dataplus._M_p =
       (pointer)&(this->BasicStyle).middle.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->BasicStyle).middle.intersect,"+","");
  (this->BasicStyle).middle.right._M_dataplus._M_p =
       (pointer)&(this->BasicStyle).middle.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).middle.right,"+","")
  ;
  (this->BasicStyle).bottom.left._M_dataplus._M_p = (pointer)&(this->BasicStyle).bottom.left.field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).bottom,"+","");
  (this->BasicStyle).bottom.intersect._M_dataplus._M_p =
       (pointer)&(this->BasicStyle).bottom.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->BasicStyle).bottom.intersect,"+","");
  (this->BasicStyle).bottom.right._M_dataplus._M_p =
       (pointer)&(this->BasicStyle).bottom.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->BasicStyle).bottom.right,"+","")
  ;
  paVar1 = &(this->LineStyle).horizontal.field_2;
  (this->LineStyle).horizontal._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->LineStyle,anon_var_dwarf_11ad0,anon_var_dwarf_11ad0 + 3);
  (this->LineStyle).vertical._M_dataplus._M_p = (pointer)&(this->LineStyle).vertical.field_2;
  local_68 = paVar1;
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this->LineStyle;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).vertical,anon_var_dwarf_11ae9,anon_var_dwarf_11ae9 + 3);
  (this->LineStyle).top.left._M_dataplus._M_p = (pointer)&(this->LineStyle).top.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).top,anon_var_dwarf_11af4,anon_var_dwarf_11af4 + 3);
  (this->LineStyle).top.intersect._M_dataplus._M_p =
       (pointer)&(this->LineStyle).top.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).top.intersect,anon_var_dwarf_11aff,
             anon_var_dwarf_11aff + 3);
  (this->LineStyle).top.right._M_dataplus._M_p = (pointer)&(this->LineStyle).top.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).top.right,anon_var_dwarf_11b0a,anon_var_dwarf_11b0a + 3);
  (this->LineStyle).middle.left._M_dataplus._M_p = (pointer)&(this->LineStyle).middle.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).middle,anon_var_dwarf_11b15,anon_var_dwarf_11b15 + 3);
  (this->LineStyle).middle.intersect._M_dataplus._M_p =
       (pointer)&(this->LineStyle).middle.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).middle.intersect,anon_var_dwarf_11b20,
             anon_var_dwarf_11b20 + 3);
  (this->LineStyle).middle.right._M_dataplus._M_p = (pointer)&(this->LineStyle).middle.right.field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).middle.right,anon_var_dwarf_11b2b,anon_var_dwarf_11b2b + 3
            );
  (this->LineStyle).bottom.left._M_dataplus._M_p = (pointer)&(this->LineStyle).bottom.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).bottom,anon_var_dwarf_11b36,anon_var_dwarf_11b36 + 3);
  (this->LineStyle).bottom.intersect._M_dataplus._M_p =
       (pointer)&(this->LineStyle).bottom.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).bottom.intersect,anon_var_dwarf_11b41,
             anon_var_dwarf_11b41 + 3);
  (this->LineStyle).bottom.right._M_dataplus._M_p = (pointer)&(this->LineStyle).bottom.right.field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->LineStyle).bottom.right,anon_var_dwarf_11b4c,anon_var_dwarf_11b4c + 3
            );
  (this->DoubleLineStyle).horizontal._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).horizontal.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->DoubleLineStyle,anon_var_dwarf_11b57,anon_var_dwarf_11b57 + 3);
  (this->DoubleLineStyle).vertical._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).vertical.field_2;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this->DoubleLineStyle;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).vertical,anon_var_dwarf_11b62,
             anon_var_dwarf_11b62 + 3);
  (this->DoubleLineStyle).top.left._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).top.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).top,anon_var_dwarf_11b6d,anon_var_dwarf_11b6d + 3);
  (this->DoubleLineStyle).top.intersect._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).top.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).top.intersect,anon_var_dwarf_11b78,
             anon_var_dwarf_11b78 + 3);
  (this->DoubleLineStyle).top.right._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).top.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).top.right,anon_var_dwarf_11b83,
             anon_var_dwarf_11b83 + 3);
  (this->DoubleLineStyle).middle.left._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).middle.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).middle,anon_var_dwarf_11b8e,anon_var_dwarf_11b8e + 3
            );
  (this->DoubleLineStyle).middle.intersect._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).middle.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).middle.intersect,anon_var_dwarf_11b99,
             anon_var_dwarf_11b99 + 3);
  (this->DoubleLineStyle).middle.right._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).middle.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).middle.right,anon_var_dwarf_11ba4,
             anon_var_dwarf_11ba4 + 3);
  local_60 = &(this->DoubleLineStyle).bottom.left.field_2;
  (this->DoubleLineStyle).bottom.left._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).bottom,anon_var_dwarf_11baf,anon_var_dwarf_11baf + 3
            );
  (this->DoubleLineStyle).bottom.intersect._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).bottom.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).bottom.intersect,anon_var_dwarf_11bba,
             anon_var_dwarf_11bba + 3);
  (this->DoubleLineStyle).bottom.right._M_dataplus._M_p =
       (pointer)&(this->DoubleLineStyle).bottom.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->DoubleLineStyle).bottom.right,anon_var_dwarf_11bc5,
             anon_var_dwarf_11bc5 + 3);
  (this->InvisibleStyle).horizontal._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).horizontal.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->InvisibleStyle," ","");
  (this->InvisibleStyle).vertical._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).vertical.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->InvisibleStyle).vertical," ","")
  ;
  (this->InvisibleStyle).top.left._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).top.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->InvisibleStyle).top," ","");
  (this->InvisibleStyle).top.intersect._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).top.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).top.intersect," ","");
  (this->InvisibleStyle).top.right._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).top.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).top.right," ","");
  local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(this->InvisibleStyle).middle;
  (this->InvisibleStyle).middle.left._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).middle.left.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60," ","");
  (this->InvisibleStyle).middle.intersect._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).middle.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).middle.intersect," ","");
  (this->InvisibleStyle).middle.right._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).middle.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).middle.right," ","");
  local_40 = &(this->InvisibleStyle).bottom.left.field_2;
  (this->InvisibleStyle).bottom.left._M_dataplus._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->InvisibleStyle).bottom," ","");
  (this->InvisibleStyle).bottom.intersect._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).bottom.intersect.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).bottom.intersect," ","");
  (this->InvisibleStyle).bottom.right._M_dataplus._M_p =
       (pointer)&(this->InvisibleStyle).bottom.right.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->InvisibleStyle).bottom.right," ","");
  TableStyle::TableStyle(&this->style,local_50);
  (this->SPACE_CHARACTER)._M_dataplus._M_p = (pointer)&(this->SPACE_CHARACTER).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->SPACE_CHARACTER," ","");
  this->padding = 1;
  if (headers._M_len != 0) {
    lVar3 = 0;
    do {
      local_38 = *(unsigned_long *)((long)&(headers._M_array)->_M_string_length + lVar3);
      __position._M_current =
           (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (local_48,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->widths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar3 = lVar3 + 0x20;
    } while (headers._M_len << 5 != lVar3);
  }
  return;
}

Assistant:

ConsoleTable::ConsoleTable(std::initializer_list<std::string> headers) : headers{headers} {
    for (const auto &column : headers) {
        widths.push_back(column.length());
    }
}